

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

void archive_mstring_clean(archive_mstring *aes)

{
  (aes->aes_wcs).length = 0;
  (aes->aes_wcs).buffer_length = 0;
  free((aes->aes_wcs).s);
  (aes->aes_wcs).s = (wchar_t *)0x0;
  (aes->aes_mbs).length = 0;
  (aes->aes_mbs).buffer_length = 0;
  free((aes->aes_mbs).s);
  (aes->aes_mbs).s = (char *)0x0;
  (aes->aes_utf8).length = 0;
  (aes->aes_utf8).buffer_length = 0;
  free((aes->aes_utf8).s);
  (aes->aes_utf8).s = (char *)0x0;
  (aes->aes_mbs_in_locale).length = 0;
  (aes->aes_mbs_in_locale).buffer_length = 0;
  free((aes->aes_mbs_in_locale).s);
  (aes->aes_mbs_in_locale).s = (char *)0x0;
  aes->aes_set = L'\0';
  return;
}

Assistant:

void
archive_mstring_clean(struct archive_mstring *aes)
{
	archive_wstring_free(&(aes->aes_wcs));
	archive_string_free(&(aes->aes_mbs));
	archive_string_free(&(aes->aes_utf8));
	archive_string_free(&(aes->aes_mbs_in_locale));
	aes->aes_set = 0;
}